

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O0

int pk_parse_key_sec1_der
              (mbedtls_pk_context_conflict *pk,uchar *key,size_t keylen,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  mbedtls_pk_context_conflict pk_00;
  uchar *buf;
  int iVar1;
  _func_int_void_ptr_uchar_ptr_size_t *end_00;
  mbedtls_ecp_keypair *key_00;
  uchar *puVar2;
  undefined8 in_stack_ffffffffffffff60;
  mbedtls_ecp_keypair *eck;
  uchar *end2;
  uchar *end;
  uchar *d;
  uchar *p;
  mbedtls_asn1_buf params;
  size_t d_len;
  size_t len;
  int local_40;
  int pubkey_done;
  int version;
  int ret;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  size_t keylen_local;
  uchar *key_local;
  mbedtls_pk_context_conflict *pk_local;
  
  pubkey_done = -0x6e;
  _version = p_rng;
  p_rng_local = f_rng;
  f_rng_local = (_func_int_void_ptr_uchar_ptr_size_t *)keylen;
  keylen_local = (size_t)key;
  key_local = (uchar *)pk;
  memset(&p,0,0x18);
  d = (uchar *)keylen_local;
  end_00 = f_rng_local + keylen_local;
  pk_00._16_8_ = in_stack_ffffffffffffff60;
  pk_00._0_16_ = *(undefined1 (*) [16])(key_local + 8);
  key_00 = mbedtls_pk_ec_rw(pk_00);
  pubkey_done = mbedtls_asn1_get_tag(&d,(uchar *)end_00,&d_len,0x30);
  if (pubkey_done == 0) {
    puVar2 = d + d_len;
    pubkey_done = mbedtls_asn1_get_int(&d,puVar2,&local_40);
    if (pubkey_done == 0) {
      if (local_40 == 1) {
        pubkey_done = mbedtls_asn1_get_tag(&d,puVar2,&d_len,4);
        buf = d;
        if (pubkey_done == 0) {
          params.p = (uchar *)d_len;
          d = d + d_len;
          len._4_4_ = 0;
          iVar1 = 0;
          if (d != puVar2) {
            pubkey_done = mbedtls_asn1_get_tag(&d,puVar2,&d_len,0xa0);
            if (pubkey_done == 0) {
              pubkey_done = pk_get_ecparams(&d,d + d_len,(mbedtls_asn1_buf *)&p);
              if ((pubkey_done != 0) ||
                 (pubkey_done = pk_use_ecparams((mbedtls_asn1_buf *)&p,
                                                (mbedtls_pk_context_conflict *)key_local),
                 pubkey_done != 0)) {
                return pubkey_done;
              }
              iVar1 = 0;
            }
            else {
              if (pubkey_done != -0x62) {
                iVar1 = mbedtls_error_add(-0x3d00,pubkey_done,
                                          "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/pkparse.c"
                                          ,0x4be);
                return iVar1;
              }
              iVar1 = -0x62;
            }
          }
          pubkey_done = iVar1;
          pubkey_done = mbedtls_ecp_read_key((key_00->grp).id,key_00,buf,(size_t)params.p);
          if (pubkey_done == 0) {
            iVar1 = 0;
            if (d != puVar2) {
              pubkey_done = mbedtls_asn1_get_tag(&d,puVar2,&d_len,0xa1);
              if (pubkey_done == 0) {
                puVar2 = d + d_len;
                pubkey_done = mbedtls_asn1_get_bitstring_null(&d,puVar2,&d_len);
                if (pubkey_done != 0) {
                  iVar1 = mbedtls_error_add(-0x3d00,pubkey_done,
                                            "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/pkparse.c"
                                            ,0x4d4);
                  return iVar1;
                }
                if (d + d_len != puVar2) {
                  iVar1 = mbedtls_error_add(-0x3d00,-0x66,
                                            "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/pkparse.c"
                                            ,0x4d9);
                  return iVar1;
                }
                iVar1 = pk_get_ecpubkey(&d,puVar2,(mbedtls_pk_context_conflict *)key_local);
                if (iVar1 == 0) {
                  len._4_4_ = 1;
                }
                else if (iVar1 != -0x4e80) {
                  return -0x3d00;
                }
              }
              else {
                if (pubkey_done != -0x62) {
                  iVar1 = mbedtls_error_add(-0x3d00,pubkey_done,
                                            "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/pkparse.c"
                                            ,0x4e8);
                  return iVar1;
                }
                iVar1 = -0x62;
              }
            }
            pubkey_done = iVar1;
            if ((len._4_4_ != 0) ||
               (pk_local._4_4_ =
                     pk_derive_public_key
                               ((mbedtls_pk_context_conflict *)key_local,buf,(size_t)params.p,
                                (_func_int_void_ptr_uchar_ptr_size_t *)p_rng_local,_version),
               pk_local._4_4_ == 0)) {
              pk_local._4_4_ = 0;
            }
          }
          else {
            pk_local._4_4_ =
                 mbedtls_error_add(-0x3d00,pubkey_done,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/pkparse.c"
                                   ,0x4c5);
          }
        }
        else {
          pk_local._4_4_ =
               mbedtls_error_add(-0x3d00,pubkey_done,
                                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/pkparse.c"
                                 ,0x4a7);
        }
      }
      else {
        pk_local._4_4_ = -0x3d80;
      }
    }
    else {
      pk_local._4_4_ =
           mbedtls_error_add(-0x3d00,pubkey_done,
                             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/pkparse.c"
                             ,0x49f);
    }
  }
  else {
    pk_local._4_4_ =
         mbedtls_error_add(-0x3d00,pubkey_done,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/pkparse.c"
                           ,0x499);
  }
  return pk_local._4_4_;
}

Assistant:

static int pk_parse_key_sec1_der(mbedtls_pk_context *pk,
                                 const unsigned char *key, size_t keylen,
                                 int (*f_rng)(void *, unsigned char *, size_t), void *p_rng)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    int version, pubkey_done;
    size_t len, d_len;
    mbedtls_asn1_buf params = { 0, 0, NULL };
    unsigned char *p = (unsigned char *) key;
    unsigned char *d;
    unsigned char *end = p + keylen;
    unsigned char *end2;
#if defined(MBEDTLS_PK_USE_PSA_EC_DATA)
    psa_key_attributes_t attributes = PSA_KEY_ATTRIBUTES_INIT;
    psa_status_t status;
#else /* MBEDTLS_PK_USE_PSA_EC_DATA */
    mbedtls_ecp_keypair *eck = mbedtls_pk_ec_rw(*pk);
#endif /* MBEDTLS_PK_USE_PSA_EC_DATA */

    /*
     * RFC 5915, or SEC1 Appendix C.4
     *
     * ECPrivateKey ::= SEQUENCE {
     *      version        INTEGER { ecPrivkeyVer1(1) } (ecPrivkeyVer1),
     *      privateKey     OCTET STRING,
     *      parameters [0] ECParameters {{ NamedCurve }} OPTIONAL,
     *      publicKey  [1] BIT STRING OPTIONAL
     *    }
     */
    if ((ret = mbedtls_asn1_get_tag(&p, end, &len,
                                    MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE)) != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_KEY_INVALID_FORMAT, ret);
    }

    end = p + len;

    if ((ret = mbedtls_asn1_get_int(&p, end, &version)) != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_KEY_INVALID_FORMAT, ret);
    }

    if (version != 1) {
        return MBEDTLS_ERR_PK_KEY_INVALID_VERSION;
    }

    if ((ret = mbedtls_asn1_get_tag(&p, end, &len, MBEDTLS_ASN1_OCTET_STRING)) != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_KEY_INVALID_FORMAT, ret);
    }

    /* Keep a reference to the position fo the private key. It will be used
     * later in this function. */
    d = p;
    d_len = len;

    p += len;

    pubkey_done = 0;
    if (p != end) {
        /*
         * Is 'parameters' present?
         */
        if ((ret = mbedtls_asn1_get_tag(&p, end, &len,
                                        MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED |
                                        0)) == 0) {
            if ((ret = pk_get_ecparams(&p, p + len, &params)) != 0 ||
                (ret = pk_use_ecparams(&params, pk)) != 0) {
                return ret;
            }
        } else if (ret != MBEDTLS_ERR_ASN1_UNEXPECTED_TAG) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_KEY_INVALID_FORMAT, ret);
        }
    }


#if !defined(MBEDTLS_PK_USE_PSA_EC_DATA)
    if ((ret = mbedtls_ecp_read_key(eck->grp.id, eck, d, d_len)) != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_KEY_INVALID_FORMAT, ret);
    }
#endif

    if (p != end) {
        /*
         * Is 'publickey' present? If not, or if we can't read it (eg because it
         * is compressed), create it from the private key.
         */
        if ((ret = mbedtls_asn1_get_tag(&p, end, &len,
                                        MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED |
                                        1)) == 0) {
            end2 = p + len;

            if ((ret = mbedtls_asn1_get_bitstring_null(&p, end2, &len)) != 0) {
                return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_KEY_INVALID_FORMAT, ret);
            }

            if (p + len != end2) {
                return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_KEY_INVALID_FORMAT,
                                         MBEDTLS_ERR_ASN1_LENGTH_MISMATCH);
            }

            if ((ret = pk_get_ecpubkey(&p, end2, pk)) == 0) {
                pubkey_done = 1;
            } else {
                /*
                 * The only acceptable failure mode of pk_get_ecpubkey() above
                 * is if the point format is not recognized.
                 */
                if (ret != MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE) {
                    return MBEDTLS_ERR_PK_KEY_INVALID_FORMAT;
                }
            }
        } else if (ret != MBEDTLS_ERR_ASN1_UNEXPECTED_TAG) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_KEY_INVALID_FORMAT, ret);
        }
    }

#if defined(MBEDTLS_PK_USE_PSA_EC_DATA)
    psa_set_key_type(&attributes, PSA_KEY_TYPE_ECC_KEY_PAIR(pk->ec_family));
    /* Setting largest masks for usage and key algorithms */
    psa_set_key_usage_flags(&attributes, PSA_KEY_USAGE_SIGN_HASH |
                            PSA_KEY_USAGE_SIGN_MESSAGE |
                            PSA_KEY_USAGE_EXPORT | PSA_KEY_USAGE_DERIVE);
#if defined(MBEDTLS_ECDSA_DETERMINISTIC)
    psa_set_key_algorithm(&attributes,
                          PSA_ALG_DETERMINISTIC_ECDSA(PSA_ALG_ANY_HASH));
#else
    psa_set_key_algorithm(&attributes, PSA_ALG_ECDSA(PSA_ALG_ANY_HASH));
#endif
    psa_set_key_enrollment_algorithm(&attributes, PSA_ALG_ECDH);

    status = psa_import_key(&attributes, d, d_len, &pk->priv_id);
    if (status != PSA_SUCCESS) {
        ret = psa_pk_status_to_mbedtls(status);
        return ret;
    }
#endif /* MBEDTLS_PK_USE_PSA_EC_DATA */

    if (!pubkey_done) {
        if ((ret = pk_derive_public_key(pk, d, d_len, f_rng, p_rng)) != 0) {
            return ret;
        }
    }

    return 0;
}